

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O2

void * density::
       heter_queue<density::runtime_type<density::f_default_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment,_density::f_ostream,_density::f_istream,_density::f_rtti>,_density::basic_default_allocator<65536UL>_>
       ::get_element(QueueControl *i_control)

{
  uintptr_t uint_pointer;
  void *pvVar1;
  
  if ((i_control->m_next & 4) == 0) {
    pvVar1 = address_upper_align(i_control + 2,*(size_t *)(i_control[1].m_next + 0x18));
    return pvVar1;
  }
  return (void *)i_control[2].m_next;
}

Assistant:

static void * get_element(detail::QueueControl * i_control) noexcept
        {
            auto result = address_add(i_control, s_sizeof_ControlBlock + s_sizeof_RuntimeType);
            if (i_control->m_next & detail::Queue_External)
            {
                result = static_cast<ExternalBlock *>(result)->m_element;
            }
            else
            {
                result = address_upper_align(result, type_after_control(i_control)->alignment());
            }
            return result;
        }